

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O1

bool common::FeeModeFromString(string *mode_string,FeeEstimateMode *fee_estimate_mode)

{
  pointer ppVar1;
  int iVar2;
  FeeEstimateMode *pFVar3;
  long in_FS_OFFSET;
  bool bVar4;
  bool bVar5;
  string_view str;
  string_view str_00;
  string searchkey;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  str._M_str = (mode_string->_M_dataplus)._M_p;
  str._M_len = mode_string->_M_string_length;
  ToUpper_abi_cxx11_(&local_58,str);
  FeeModeMap_abi_cxx11_();
  ppVar1 = FeeModeMap[abi:cxx11]()::FEE_MODES_abi_cxx11_.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar4 = FeeModeMap[abi:cxx11]()::FEE_MODES_abi_cxx11_.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          FeeModeMap[abi:cxx11]()::FEE_MODES_abi_cxx11_.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  if (bVar4) {
    pFVar3 = &(FeeModeMap[abi:cxx11]()::FEE_MODES_abi_cxx11_.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->second;
    do {
      str_00._M_str =
           (((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>
              *)(pFVar3 + -8))->first)._M_dataplus._M_p;
      str_00._M_len = *(size_type *)(pFVar3 + -6);
      ToUpper_abi_cxx11_(&local_78,str_00);
      if (local_78._M_string_length == local_58._M_string_length) {
        if (local_78._M_string_length == 0) {
          bVar5 = true;
        }
        else {
          iVar2 = bcmp(local_78._M_dataplus._M_p,local_58._M_dataplus._M_p,local_78._M_string_length
                      );
          bVar5 = iVar2 == 0;
        }
      }
      else {
        bVar5 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if (bVar5) {
        *fee_estimate_mode = *pFVar3;
        break;
      }
      bVar4 = (pointer)(pFVar3 + 2) != ppVar1;
      pFVar3 = pFVar3 + 10;
    } while (bVar4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool FeeModeFromString(const std::string& mode_string, FeeEstimateMode& fee_estimate_mode)
{
    auto searchkey = ToUpper(mode_string);
    for (const auto& pair : FeeModeMap()) {
        if (ToUpper(pair.first) == searchkey) {
            fee_estimate_mode = pair.second;
            return true;
        }
    }
    return false;
}